

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_qadd_s64_arm(CPUARMState *env,uint64_t src1,uint64_t src2)

{
  ulong local_28;
  uint64_t res;
  uint64_t src2_local;
  uint64_t src1_local;
  CPUARMState *env_local;
  
  local_28 = src1 + src2;
  if ((((local_28 ^ src1) & 0x8000000000000000) != 0) && (((src1 ^ src2) & 0x8000000000000000) == 0)
     ) {
    (env->vfp).qc[0] = 1;
    local_28 = (long)src1 >> 0x3f ^ 0x7fffffffffffffff;
  }
  return local_28;
}

Assistant:

uint64_t HELPER(neon_qadd_s64)(CPUARMState *env, uint64_t src1, uint64_t src2)
{
    uint64_t res;

    res = src1 + src2;
    if (((res ^ src1) & SIGNBIT64) && !((src1 ^ src2) & SIGNBIT64)) {
        SET_QC();
        res = ((int64_t)src1 >> 63) ^ ~SIGNBIT64;
    }
    return res;
}